

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::builtins::AssertControlTask::bindArgument
          (AssertControlTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  Scope *pSVar1;
  Compilation *this_00;
  bool bVar2;
  Compilation *compilation;
  Expression *pEVar3;
  bitmask<slang::ast::LookupFlags> extraLookupFlags;
  Args *pAVar4;
  
  bVar2 = argIndex != 0;
  if ((this->super_SystemTaskBase).super_SystemSubroutine.field_0x34 != '\0') {
    bVar2 = 3 < argIndex;
  }
  if (bVar2) {
    pAVar4 = args;
    bVar2 = slang::syntax::NameSyntax::isKind((syntax->super_SyntaxNode).kind);
    extraLookupFlags.m_bits = (underlying_type)pAVar4;
    if (bVar2) {
      pSVar1 = (context->scope).ptr;
      if (pSVar1 != (Scope *)0x0) {
        this_00 = pSVar1->compilation;
        compilation = (Compilation *)
                      slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>
                                (&syntax->super_SyntaxNode);
        pEVar3 = HierarchicalReferenceExpression::fromSyntax
                           ((HierarchicalReferenceExpression *)this_00,compilation,
                            (NameSyntax *)context,(ASTContext *)0x0,extraLookupFlags);
        return pEVar3;
      }
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
                );
    }
  }
  pEVar3 = SystemSubroutine::bindArgument((SystemSubroutine *)this,argIndex,context,syntax,args);
  return pEVar3;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if ((isFullMethod && argIndex < 4) || (!isFullMethod && argIndex == 0) ||
            !NameSyntax::isKind(syntax.kind)) {
            return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
        }

        return HierarchicalReferenceExpression::fromSyntax(context.getCompilation(),
                                                           syntax.as<NameSyntax>(), context);
    }